

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int propagateConstants(Parse *pParse,Select *p)

{
  SrcList *pSVar1;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  WhereConst x;
  Walker w;
  Parse *local_90;
  u8 *local_88;
  undefined8 local_80;
  int local_78;
  u32 local_74;
  Expr **local_70;
  Walker local_68;
  
  local_88 = &pParse->db->mallocFailed;
  local_90 = pParse;
  do {
    local_80._0_4_ = 0;
    local_80._4_4_ = 0;
    local_70 = (Expr **)0x0;
    local_78 = 0;
    pSVar1 = p->pSrc;
    if (((pSVar1 == (SrcList *)0x0) || (pSVar1->nSrc < 1)) ||
       ((pSVar1->a[0].fg.jointype & 0x40) == 0)) {
      local_74 = 1;
    }
    else {
      local_74 = 3;
    }
    findConstInWhere(((NameContext *)&local_90).pConst,p->pWhere);
    iVar2 = extraout_EAX;
    if ((int)local_80 != 0) {
      iVar2 = 0x184894;
      local_68.xExprCallback = propagateConstantExprRewrite;
      local_68.xSelectCallback = sqlite3SelectWalkNoop;
      local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_68.walkerDepth = 0;
      local_68.eCode = 0;
      local_68.mWFlags = 0;
      local_68.pParse = pParse;
      local_68.u.pNC = ((NameContext *)&local_90).pNC;
      if (p->pWhere != (Expr *)0x0) {
        iVar2 = sqlite3WalkExprNN(&local_68,p->pWhere);
      }
      if (local_70 != (Expr **)0x0) {
        sqlite3DbFreeNN(local_90->db,local_70);
        iVar2 = extraout_EAX_00;
      }
    }
  } while (local_80._4_4_ != 0);
  return iVar2;
}

Assistant:

static int propagateConstants(
  Parse *pParse,   /* The parsing context */
  Select *p        /* The query in which to propagate constants */
){
  WhereConst x;
  Walker w;
  int nChng = 0;
  x.pParse = pParse;
  x.pOomFault = &pParse->db->mallocFailed;
  do{
    x.nConst = 0;
    x.nChng = 0;
    x.apExpr = 0;
    x.bHasAffBlob = 0;
    if( ALWAYS(p->pSrc!=0)
     && p->pSrc->nSrc>0
     && (p->pSrc->a[0].fg.jointype & JT_LTORJ)!=0
    ){
      /* Do not propagate constants on any ON clause if there is a
      ** RIGHT JOIN anywhere in the query */
      x.mExcludeOn = EP_InnerON | EP_OuterON;
    }else{
      /* Do not propagate constants through the ON clause of a LEFT JOIN */
      x.mExcludeOn = EP_OuterON;
    }
    findConstInWhere(&x, p->pWhere);
    if( x.nConst ){
      memset(&w, 0, sizeof(w));
      w.pParse = pParse;
      w.xExprCallback = propagateConstantExprRewrite;
      w.xSelectCallback = sqlite3SelectWalkNoop;
      w.xSelectCallback2 = 0;
      w.walkerDepth = 0;
      w.u.pConst = &x;
      sqlite3WalkExpr(&w, p->pWhere);
      sqlite3DbFree(x.pParse->db, x.apExpr);
      nChng += x.nChng;
    }
  }while( x.nChng );
  return nChng;
}